

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,LoopStatement *l)

{
  FunctionBuilder *this_00;
  uint index;
  bool bVar1;
  BoundedIntSize v;
  Block *falseBranch;
  Block *target;
  Block *target_00;
  VariableDeclaration *pVVar2;
  Variable *pVVar3;
  Variable *pVVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Constant *pCVar7;
  int64_t iVar8;
  Constant *pCVar9;
  Block *target_01;
  pool_ptr<soul::AST::VariableDeclaration> rangeLoopVar;
  Type type;
  pool_ptr<soul::AST::Constant> c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  pool_ptr<soul::AST::Expression> *local_220;
  Block *local_218;
  pool_ptr<soul::AST::Constant> constNumIterations;
  CodeLocation local_208;
  CodeLocation local_1f8;
  Type local_1e8;
  Type local_1d0;
  Block *local_1b8;
  Block *pBStack_1b0;
  pool_ptr<soul::heart::Block> local_1a0;
  pool_ptr<soul::AST::Statement> local_198;
  pool_ptr<soul::heart::Block> local_190;
  pool_ptr<soul::AST::Statement> local_188;
  pool_ptr<soul::heart::Block> local_180;
  pool_ptr<soul::heart::Block> local_178;
  pool_ptr<soul::heart::Block> local_170;
  pool_ptr<soul::heart::Block> local_168;
  pool_ptr<soul::heart::Block> local_160;
  pool_ptr<soul::AST::Statement> local_158;
  pool_ptr<soul::heart::Block> local_150;
  pool_ptr<soul::heart::Block> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  pool_ptr<soul::heart::Block> local_120;
  pool_ptr<soul::AST::Statement> local_118;
  pool_ptr<soul::heart::Block> local_110;
  pool_ptr<soul::heart::Block> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Value local_e0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  index = this->loopIndex;
  this->loopIndex = index + 1;
  local_1b8 = (this->breakTarget).object;
  pBStack_1b0 = (this->continueTarget).object;
  this_00 = &this->builder;
  falseBranch = FunctionBuilder::createBlock(this_00,"@break_",index);
  local_218 = FunctionBuilder::createBlock(this_00,"@cont_",index);
  (this->breakTarget).object = falseBranch;
  (this->continueTarget).object = local_218;
  target = FunctionBuilder::createBlock(this_00,"@loop_",index);
  target_00 = FunctionBuilder::createBlock(this_00,"@body_",index);
  rangeLoopVar.object = (l->rangeLoopInitialiser).object;
  if (rangeLoopVar.object == (VariableDeclaration *)0x0) {
    if ((l->numIterations).object == (Expression *)0x0) {
      local_168.object = target;
      FunctionBuilder::beginBlock(this_00,&local_168);
      if ((l->condition).object == (Expression *)0x0) {
        local_170.object = target_00;
        FunctionBuilder::addBranch(this_00,target_00,&local_170);
      }
      else {
        pEVar6 = pool_ptr<soul::AST::Expression>::operator->(&l->condition);
        (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&c,pEVar6);
        if (c.object == (Constant *)0x0) {
          pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&l->condition);
          local_180.object = target_00;
          addBranchIf(this,pEVar6,target_00,falseBranch,&local_180);
        }
        else {
          pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&c);
          bVar1 = soul::Value::getAsBool(&pCVar7->value);
          target_01 = falseBranch;
          if (bVar1) {
            target_01 = target_00;
          }
          local_178.object = target_00;
          FunctionBuilder::addBranch(this_00,target_01,&local_178);
        }
      }
      local_188.object = (l->body).object;
      visitAsStatement(this,&local_188);
      local_190.object = local_218;
      FunctionBuilder::beginBlock(this_00,&local_190);
      local_198.object = (l->iterator).object;
      visitAsStatement(this,&local_198);
      goto LAB_0023f88a;
    }
    if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
      throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",0x33a);
    }
    local_220 = &l->numIterations;
    pEVar6 = pool_ptr<soul::AST::Expression>::operator->(local_220);
    (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[4])(&type,pEVar6);
    if ((1 < type.primitiveType.type - int32) || (type.category != primitive)) {
      pEVar6 = pool_ptr<soul::AST::Expression>::operator->(local_220);
      Errors::expectedInteger<>();
      AST::Context::throwError(&(pEVar6->super_Statement).super_ASTObject.context,&local_a0,false);
    }
    if (type.primitiveType.type == int64) {
      pEVar6 = pool_ptr<soul::AST::Expression>::operator->(local_220);
      (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&constNumIterations,pEVar6);
      if (constNumIterations.object != (Constant *)0x0) {
        pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constNumIterations);
        iVar8 = soul::Value::getAsInt64(&pCVar7->value);
        if (iVar8 < 0x80000000) {
          c.object = (Constant *)0x700000001;
          aStack_230._M_allocated_capacity = 0;
          Type::operator=(&type,(Type *)&c);
          RefCountedPtr<soul::Structure>::~RefCountedPtr
                    ((RefCountedPtr<soul::Structure> *)&aStack_230._M_allocated_capacity);
        }
      }
    }
    else {
      type.primitiveType.type = int32;
    }
    local_1e8.category = type.category;
    local_1e8.arrayElementCategory = type.arrayElementCategory;
    local_1e8.isRef = type.isRef;
    local_1e8.isConstant = type.isConstant;
    local_1e8.boundingSize = type.boundingSize;
    local_1e8.arrayElementBoundingSize = type.arrayElementBoundingSize;
    local_1e8.structure.object = type.structure.object;
    if (type.structure.object != (Structure *)0x0) {
      ((type.structure.object)->super_RefCountedObject).refCount =
           ((type.structure.object)->super_RefCountedObject).refCount + 1;
    }
    local_1e8.primitiveType.type = type.primitiveType.type;
    std::__cxx11::to_string((string *)&c,index);
    std::operator+(&local_140,"$counter_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c);
    pVVar3 = BlockBuilder::createMutableLocalVariable
                       (&this_00->super_BlockBuilder,&local_1e8,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&c);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1e8.structure);
    pEVar6 = pool_ptr<soul::AST::Expression>::operator*(local_220);
    pEVar5 = evaluateAsExpression(this,pEVar6);
    pEVar5 = BlockBuilder::createCastIfNeeded(&this_00->super_BlockBuilder,pEVar5,&type);
    BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar3->super_Expression,pEVar5);
    local_148.object = target;
    FunctionBuilder::beginBlock(this_00,&local_148);
    local_208.sourceCode.object =
         (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
    if (local_208.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_208.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_208.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_208.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
    pCVar9 = BlockBuilder::createZeroInitialiser(&this_00->super_BlockBuilder,&type);
    pEVar5 = BlockBuilder::createBinaryOp
                       (&this_00->super_BlockBuilder,&local_208,&pVVar3->super_Expression,
                        &pCVar9->super_Expression,greaterThan);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_208.sourceCode);
    local_150.object = target_00;
    FunctionBuilder::addBranchIf(this_00,pEVar5,target_00,falseBranch,&local_150);
    local_158.object = (l->body).object;
    visitAsStatement(this,&local_158);
    local_160.object = local_218;
    FunctionBuilder::beginBlock(this_00,&local_160);
    BlockBuilder::decrementValue(&this_00->super_BlockBuilder,&pVVar3->super_Expression);
  }
  else {
    if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
      throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",799);
    }
    pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&rangeLoopVar);
    AST::VariableDeclaration::getType(&type,pVVar2);
    if ((type.category & ~primitive) != wrap) {
      pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&rangeLoopVar);
      Errors::rangeBasedForMustBeWrapType<>();
      AST::Context::throwError(&(pVVar2->super_Statement).super_ASTObject.context,&local_68,false);
    }
    v = Type::getBoundedIntLimit(&type);
    local_1d0.category = primitive;
    local_1d0.arrayElementCategory = invalid;
    local_1d0.isRef = false;
    local_1d0.isConstant = false;
    local_1d0.primitiveType.type = int32;
    local_1d0.boundingSize = 0;
    local_1d0.arrayElementBoundingSize = 0;
    local_1d0.structure.object = (Structure *)0x0;
    std::__cxx11::to_string((string *)&c,index);
    std::operator+(&local_100,"$counter_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c);
    pVVar3 = BlockBuilder::createMutableLocalVariable
                       (&this_00->super_BlockBuilder,&local_1d0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&c);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1d0.structure);
    pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&rangeLoopVar);
    if ((pVVar2->initialValue).object == (Expression *)0x0) {
      BlockBuilder::addZeroAssignment(&this_00->super_BlockBuilder,&pVVar3->super_Expression);
    }
    else {
      pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&rangeLoopVar);
      pVVar4 = pool_ptr<soul::heart::Variable>::operator*(&pVVar2->generatedVariable);
      c.object = (Constant *)0x700000001;
      aStack_230._M_allocated_capacity = 0;
      pEVar5 = BlockBuilder::createCastIfNeeded
                         (&this_00->super_BlockBuilder,&pVVar4->super_Expression,(Type *)&c);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar3->super_Expression,pEVar5);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)&aStack_230._M_allocated_capacity);
    }
    local_108.object = target;
    FunctionBuilder::beginBlock(this_00,&local_108);
    local_1f8.sourceCode.object =
         (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
    if (local_1f8.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_1f8.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_1f8.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_1f8.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
    soul::Value::Value(&local_e0,v);
    pCVar9 = BlockBuilder::createConstant(&this_00->super_BlockBuilder,&local_e0);
    pEVar5 = BlockBuilder::createBinaryOp
                       (&this_00->super_BlockBuilder,&local_1f8,&pVVar3->super_Expression,
                        &pCVar9->super_Expression,lessThan);
    soul::Value::~Value(&local_e0);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1f8.sourceCode);
    local_110.object = target_00;
    FunctionBuilder::addBranchIf(this_00,pEVar5,target_00,falseBranch,&local_110);
    pVVar2 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&rangeLoopVar);
    pVVar4 = pool_ptr<soul::heart::Variable>::operator*(&pVVar2->generatedVariable);
    BlockBuilder::addCastOrAssignment
              (&this_00->super_BlockBuilder,&pVVar4->super_Expression,&pVVar3->super_Expression);
    local_118.object = (l->body).object;
    visitAsStatement(this,&local_118);
    local_120.object = local_218;
    FunctionBuilder::beginBlock(this_00,&local_120);
    BlockBuilder::incrementValue(&this_00->super_BlockBuilder,&pVVar3->super_Expression);
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&type.structure);
LAB_0023f88a:
  local_1a0.object = falseBranch;
  FunctionBuilder::addBranch(this_00,target,&local_1a0);
  (this->breakTarget).object = local_1b8;
  (this->continueTarget).object = pBStack_1b0;
  return;
}

Assistant:

void visit (AST::LoopStatement& l) override
    {
        auto labelIndex = loopIndex++;
        auto oldbreakTarget = breakTarget;
        auto oldcontinueTarget = continueTarget;
        auto& breakBlock    = builder.createBlock ("@break_", labelIndex);
        auto& continueBlock = builder.createBlock ("@cont_",  labelIndex);

        breakTarget = breakBlock;
        continueTarget = continueBlock;

        auto& startBlock = builder.createBlock ("@loop_", labelIndex);
        auto& bodyBlock  = builder.createBlock ("@body_", labelIndex);

        if (auto rangeLoopVar = l.rangeLoopInitialiser)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto type = rangeLoopVar->getType();

            if (! type.isBoundedInt())
                rangeLoopVar->context.throwError (Errors::rangeBasedForMustBeWrapType());

            auto numIterations = type.getBoundedIntLimit();
            auto& counterVar = builder.createMutableLocalVariable (Type::getBoundedIntSizeType(), "$counter_" + std::to_string (labelIndex));

            if (auto init = rangeLoopVar->initialValue)
                builder.addAssignment (counterVar, builder.createCastIfNeeded (rangeLoopVar->getGeneratedVariable(), Type::getBoundedIntSizeType()));
            else
                builder.addZeroAssignment (counterVar);

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createConstant (Value (numIterations)),
                                                             BinaryOp::Op::lessThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);

            builder.addCastOrAssignment (rangeLoopVar->getGeneratedVariable(), counterVar);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.incrementValue (counterVar);
        }
        else if (l.numIterations != nullptr)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto indexType = l.numIterations->getResultType();

            if (! indexType.isPrimitiveInteger())
                l.numIterations->context.throwError (Errors::expectedInteger());

            if (indexType.isInteger64())
            {
                if (auto constNumIterations = l.numIterations->getAsConstant())
                {
                    auto num = constNumIterations->value.getAsInt64();

                    if (num <= 0x7fffffff)
                        indexType = PrimitiveType::int32;
                }
            }

            auto& counterVar = builder.createMutableLocalVariable (indexType, "$counter_" + std::to_string (labelIndex));
            builder.addAssignment (counterVar, builder.createCastIfNeeded (evaluateAsExpression (*l.numIterations), indexType));

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createZeroInitialiser (indexType),
                                                             BinaryOp::Op::greaterThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.decrementValue (counterVar);
        }
        else
        {
            builder.beginBlock (startBlock);

            if (l.condition == nullptr)
                builder.addBranch (bodyBlock, bodyBlock);
            else if (auto c = l.condition->getAsConstant())
                builder.addBranch (c->value.getAsBool() ? bodyBlock : breakBlock, bodyBlock);
            else
                addBranchIf (*l.condition, bodyBlock, breakBlock, bodyBlock);

            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            visitAsStatement (l.iterator);
        }

        builder.addBranch (startBlock, breakBlock);
        breakTarget = oldbreakTarget;
        continueTarget = oldcontinueTarget;
    }